

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strspn(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  int iVar2;
  jx9_value *pjVar3;
  long lVar4;
  uint uVar5;
  sxi32 sVar6;
  char *zIn;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  jx9_real jVar10;
  int iLen;
  int iMasklen;
  char *zString;
  SyString sToken;
  int local_58;
  uint local_54;
  char *local_50;
  char *local_48;
  SyString local_40;
  
  if (1 < nArg) {
    pcVar7 = jx9_value_to_string(*apArg,&local_58);
    local_50 = pcVar7;
    local_48 = jx9_value_to_string(apArg[1],(int *)&local_54);
    jVar10 = 0.0;
    if (local_58 < 1) {
LAB_00132a64:
      jVar10 = 0.0;
      goto LAB_00132b4f;
    }
    if ((int)local_54 < 1) goto LAB_00132b4f;
    if (nArg != 2) {
      pjVar3 = apArg[2];
      jx9MemObjToInteger(pjVar3);
      uVar5 = (uint)(pjVar3->x).iVal;
      if ((int)uVar5 < 0) {
        uVar9 = local_58 + uVar5;
        if (uVar9 == 0 || SCARRY4(local_58,uVar5) != (int)uVar9 < 0) {
          pjVar3 = pCtx->pRet;
          jx9MemObjRelease(pjVar3);
          (pjVar3->x).rVal = 0.0;
          pjVar3->iFlags = pjVar3->iFlags & 0xfffffe90U | 2;
        }
        else {
          local_50 = pcVar7 + uVar9;
          local_58 = -uVar5;
        }
        if ((int)uVar9 < 1) {
          return 0;
        }
      }
      else {
        if (local_58 - uVar5 == 0 || local_58 < (int)uVar5) goto LAB_00132a64;
        local_50 = pcVar7 + (uVar5 & 0x7fffffff);
        local_58 = local_58 - uVar5;
      }
      if (3 < nArg) {
        pjVar3 = apArg[3];
        jx9MemObjToInteger(pjVar3);
        iVar2 = *(int *)&pjVar3->x;
        if ((0 < iVar2) && (iVar2 < local_58)) {
          local_58 = iVar2;
        }
      }
    }
    sVar6 = ExtractNonSpaceToken(&local_50,local_50 + local_58,&local_40);
    if (local_40.nByte != 0 && sVar6 == 0) {
      pcVar7 = local_40.zString;
      if ((0 < (int)local_40.nByte) && (0 < (long)(int)local_54)) {
        do {
          if (*pcVar7 != *local_48) {
            lVar8 = 0;
            do {
              if ((ulong)local_54 - 1 == lVar8) goto LAB_00132b4a;
              lVar1 = lVar8 + 1;
              lVar4 = lVar8 + 1;
              lVar8 = lVar1;
            } while (*pcVar7 != local_48[lVar4]);
            if ((int)local_54 <= lVar1) break;
          }
          pcVar7 = pcVar7 + 1;
        } while (pcVar7 < local_40.zString + (int)local_40.nByte);
      }
LAB_00132b4a:
      jVar10 = (jx9_real)(long)((int)pcVar7 - (int)local_40.zString);
      goto LAB_00132b4f;
    }
  }
  jVar10 = 0.0;
LAB_00132b4f:
  pjVar3 = pCtx->pRet;
  jx9MemObjRelease(pjVar3);
  (pjVar3->x).rVal = jVar10;
  pjVar3->iFlags = pjVar3->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9Builtin_strspn(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zMask, *zEnd;
	int iMasklen, iLen;
	SyString sToken;
	int iCount = 0;
	int rc;
	if( nArg < 2 ){
		/* Missing agruments, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &iLen);
	/* Extract the mask */
	zMask = jx9_value_to_string(apArg[1], &iMasklen);
	if( iLen < 1 || iMasklen < 1 ){
		/* Nothing to process, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 2 ){
		int nOfft;
		/* Extract the offset */
		nOfft = jx9_value_to_int(apArg[2]);
		if( nOfft < 0 ){
			const char *zBase = &zString[iLen + nOfft];
			if( zBase > zString ){
				iLen = (int)(&zString[iLen]-zBase);
				zString = zBase;	
			}else{
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}
		}else{
			if( nOfft >= iLen ){
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}else{
				/* Update offset */
				zString += nOfft;
				iLen -= nOfft;
			}
		}
		if( nArg > 3 ){
			int iUserlen;
			/* Extract the desired length */
			iUserlen = jx9_value_to_int(apArg[3]);
			if( iUserlen > 0 && iUserlen < iLen ){
				iLen = iUserlen;
			}
		}
	}
	/* Point to the end of the string */
	zEnd = &zString[iLen];
	/* Extract the first non-space token */
	rc = ExtractNonSpaceToken(&zString, zEnd, &sToken);
	if( rc == SXRET_OK && sToken.nByte > 0 ){
		/* Compare against the current mask */
		iCount = LongestStringMask(sToken.zString, (int)sToken.nByte, zMask, iMasklen);
	}
	/* Longest match */
	jx9_result_int(pCtx, iCount);
	return JX9_OK;
}